

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O1

decNumber *
uprv_decNumberFMA_63(decNumber *res,decNumber *lhs,decNumber *rhs,decNumber *fhs,decContext *set)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  decNumber *res_00;
  decNumber *buffer;
  ulong uVar4;
  uint32_t status;
  decContext dcmul;
  decNumber dzero;
  decNumber bufa [7];
  uint32_t local_c4;
  decNumber *local_c0;
  decContext local_b8;
  decNumber local_94;
  decNumber local_88 [7];
  
  local_c4 = 0;
  if (((((lhs->bits & 0x70) == 0) && (uVar3 = decCheckMath(lhs,set,&local_c4), uVar3 != 0)) ||
      (((rhs->bits & 0x70) == 0 && (uVar3 = decCheckMath(rhs,set,&local_c4), uVar3 != 0)))) ||
     (((fhs->bits & 0x70) == 0 && (uVar3 = decCheckMath(fhs,set,&local_c4), uVar3 != 0)))) {
LAB_00247e6f:
    buffer = (decNumber *)0x0;
  }
  else {
    uVar1 = set->round;
    uVar2 = set->traps;
    local_b8.status = set->status;
    local_b8.clamp = set->clamp;
    local_b8._25_3_ = *(undefined3 *)&set->field_0x19;
    uVar4 = (long)rhs->digits + (long)lhs->digits;
    local_b8.digits = (int32_t)uVar4;
    local_b8.emax = 999999999;
    local_b8.emin = -999999999;
    if (local_b8.digits < 0x32) {
      uVar4 = (ulong)""[uVar4];
    }
    local_b8.round = uVar1;
    local_b8.traps = uVar2;
    if ((uint)uVar4 < 0x4a) {
      res_00 = local_88;
      buffer = (decNumber *)0x0;
    }
    else {
      res_00 = (decNumber *)uprv_malloc_63((ulong)((uint)uVar4 + 0xb));
      buffer = res_00;
      if (res_00 == (decNumber *)0x0) {
        local_c4 = local_c4 | 0x10;
        goto LAB_00247e6f;
      }
    }
    local_c0 = fhs;
    decMultiplyOp(res_00,lhs,rhs,&local_b8,&local_c4);
    if ((char)local_c4 < '\0') {
      if ((local_c4 >> 0x1e & 1) == 0) {
        res->bits = '\0';
        res->lsu[0] = '\0';
        res->digits = 1;
        res->exponent = 0;
        res->bits = ' ';
        goto LAB_00247ea5;
      }
      local_c0 = &local_94;
      local_94.bits = '\0';
      local_94.lsu[0] = '\0';
      local_94.digits = 1;
      local_94.exponent = 0;
    }
    decAddOp(res,res_00,local_c0,set,'\0',&local_c4);
  }
LAB_00247ea5:
  if (buffer != (decNumber *)0x0) {
    uprv_free_63(buffer);
  }
  if (local_c4 != 0) {
    decStatus(res,local_c4,set);
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberFMA(decNumber *res, const decNumber *lhs,
                         const decNumber *rhs, const decNumber *fhs,
                         decContext *set) {
  uInt status=0;                   /* accumulator  */
  decContext dcmul;                /* context for the multiplication  */
  uInt needbytes;                  /* for space calculations  */
  decNumber bufa[D2N(DECBUFFER*2+1)];
  decNumber *allocbufa=NULL;       /* -> allocated bufa, iff allocated  */
  decNumber *acc;                  /* accumulator pointer  */
  decNumber dzero;                 /* work  */

  #if DECCHECK
  if (decCheckOperands(res, lhs, rhs, set)) return res;
  if (decCheckOperands(res, fhs, DECUNUSED, set)) return res;
  #endif

  do {                                  /* protect allocated storage  */
    #if DECSUBSET
    if (!set->extended) {               /* [undefined if subset]  */
      status|=DEC_Invalid_operation;
      break;}
    #endif
    /* Check math restrictions [these ensure no overflow or underflow]  */
    if ((!decNumberIsSpecial(lhs) && decCheckMath(lhs, set, &status))
     || (!decNumberIsSpecial(rhs) && decCheckMath(rhs, set, &status))
     || (!decNumberIsSpecial(fhs) && decCheckMath(fhs, set, &status))) break;
    /* set up context for multiply  */
    dcmul=*set;
    dcmul.digits=lhs->digits+rhs->digits; /* just enough  */
    /* [The above may be an over-estimate for subset arithmetic, but that's OK]  */
    dcmul.emax=DEC_MAX_EMAX;            /* effectively unbounded ..  */
    dcmul.emin=DEC_MIN_EMIN;            /* [thanks to Math restrictions]  */
    /* set up decNumber space to receive the result of the multiply  */
    acc=bufa;                           /* may fit  */
    needbytes=sizeof(decNumber)+(D2U(dcmul.digits)-1)*sizeof(Unit);
    if (needbytes>sizeof(bufa)) {       /* need malloc space  */
      allocbufa=(decNumber *)malloc(needbytes);
      if (allocbufa==NULL) {            /* hopeless -- abandon  */
        status|=DEC_Insufficient_storage;
        break;}
      acc=allocbufa;                    /* use the allocated space  */
      }
    /* multiply with extended range and necessary precision  */
    /*printf("emin=%ld\n", dcmul.emin);  */
    decMultiplyOp(acc, lhs, rhs, &dcmul, &status);
    /* Only Invalid operation (from sNaN or Inf * 0) is possible in  */
    /* status; if either is seen than ignore fhs (in case it is  */
    /* another sNaN) and set acc to NaN unless we had an sNaN  */
    /* [decMultiplyOp leaves that to caller]  */
    /* Note sNaN has to go through addOp to shorten payload if  */
    /* necessary  */
    if ((status&DEC_Invalid_operation)!=0) {
      if (!(status&DEC_sNaN)) {         /* but be true invalid  */
        uprv_decNumberZero(res);             /* acc not yet set  */
        res->bits=DECNAN;
        break;
        }
      uprv_decNumberZero(&dzero);            /* make 0 (any non-NaN would do)  */
      fhs=&dzero;                       /* use that  */
      }
    #if DECCHECK
     else { /* multiply was OK  */
      if (status!=0) printf("Status=%08lx after FMA multiply\n", (LI)status);
      }
    #endif
    /* add the third operand and result -> res, and all is done  */
    decAddOp(res, acc, fhs, set, 0, &status);
    } while(0);                         /* end protected  */

  if (allocbufa!=NULL) free(allocbufa); /* drop any storage used  */
  if (status!=0) decStatus(res, status, set);
  #if DECCHECK
  decCheckInexact(res, set);
  #endif
  return res;
  }